

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddImportError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  Type *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  if (this->pool_->fallback_database_ == (DescriptorDatabase *)0x0) {
    pTVar1 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(proto->dependency_).super_RepeatedPtrFieldBase,index);
    std::operator+(&bStack_78,"Import \"",pTVar1);
    std::operator+(&local_38,&bStack_78,"\" has not been loaded.");
  }
  else {
    pTVar1 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(proto->dependency_).super_RepeatedPtrFieldBase,index);
    std::operator+(&bStack_78,"Import \"",pTVar1);
    std::operator+(&local_38,&bStack_78,"\" was not found or had errors.");
  }
  std::__cxx11::string::operator=((string *)&message,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_78);
  AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,&message);
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void DescriptorBuilder::AddImportError(const FileDescriptorProto& proto,
                                       int index) {
  string message;
  if (pool_->fallback_database_ == NULL) {
    message = "Import \"" + proto.dependency(index) +
              "\" has not been loaded.";
  } else {
    message = "Import \"" + proto.dependency(index) +
              "\" was not found or had errors.";
  }
  AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER, message);
}